

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setTransformOriginPoint(QGraphicsItem *this,QPointF *origin)

{
  TransformData *pTVar1;
  long lVar2;
  qreal *pqVar3;
  TransformData *pTVar4;
  QGraphicsItemPrivate *pQVar5;
  long in_FS_OFFSET;
  byte bVar6;
  qreal in_XMM1_Qa;
  QPointF local_98;
  QVariant local_88;
  enable_if_t<std::is_copy_constructible_v<QPointF>_&&_std::is_destructible_v<QPointF>,_QVariant>
  local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  bVar6 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  prepareGeometryChange(this);
  local_98.xp = origin->xp;
  local_98.yp = origin->yp;
  pQVar5 = (this->d_ptr).d;
  if ((pQVar5->field_0x165 & 8) != 0) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::fromValue<QPointF>(&local_68,origin);
    (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0x20,&local_68);
    ::QVariant::~QVariant(&local_68);
    local_98.xp = (qreal)::QVariant::toPointF();
    local_98.yp = in_XMM1_Qa;
    ::QVariant::~QVariant((QVariant *)&local_48);
    pQVar5 = (this->d_ptr).d;
  }
  pTVar1 = pQVar5->transformData;
  if (pTVar1 == (TransformData *)0x0) {
    pTVar1 = (TransformData *)operator_new(0x90);
    pqVar3 = (qreal *)&DAT_006777b8;
    pTVar4 = pTVar1;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pTVar4->transform).m_matrix[0][0] = *pqVar3;
      pqVar3 = pqVar3 + (ulong)bVar6 * -2 + 1;
      pTVar4 = (TransformData *)((long)pTVar4 + (ulong)bVar6 * -0x10 + 8);
    }
    *(undefined2 *)&(pTVar1->transform).field_0x48 = 0;
    pTVar1->scale = 1.0;
    pTVar1->rotation = 0.0;
    pTVar1->xOrigin = 0.0;
    pTVar1->yOrigin = 0.0;
    (pTVar1->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar1->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar1->graphicsTransforms).d.size = 0;
    pTVar1->onlyTransform = true;
    pQVar5->transformData = pTVar1;
  }
  if ((pTVar1->xOrigin == local_98.xp) && (!NAN(pTVar1->xOrigin) && !NAN(local_98.xp))) {
    if ((pTVar1->yOrigin == local_98.yp) && (!NAN(pTVar1->yOrigin) && !NAN(local_98.yp)))
    goto LAB_005769c7;
  }
  pTVar1->xOrigin = local_98.xp;
  pTVar1->yOrigin = local_98.yp;
  pTVar1->onlyTransform = false;
  pQVar5->field_0x166 = pQVar5->field_0x166 | 0x20;
  if ((*(ulong *)&((this->d_ptr).d)->field_0x160 & 0x80000000000) != 0) {
    ::QVariant::fromValue<QPointF>
              ((enable_if_t<std::is_copy_constructible_v<QPointF>_&&_std::is_destructible_v<QPointF>,_QVariant>
                *)&local_48,&local_98);
    (*this->_vptr_QGraphicsItem[0x21])(&local_88,this,0x21,&local_48);
    ::QVariant::~QVariant(&local_88);
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
LAB_005769c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setTransformOriginPoint(const QPointF &origin)
{
    prepareGeometryChange();
    QPointF newOrigin = origin;

    if (d_ptr->flags & ItemSendsGeometryChanges) {
        // Notify the item that the origin point is changing.
        const QVariant newOriginVariant(itemChange(ItemTransformOriginPointChange,
                                                   QVariant::fromValue<QPointF>(origin)));
        newOrigin = newOriginVariant.toPointF();
    }

    if (!d_ptr->transformData)
        d_ptr->transformData = new QGraphicsItemPrivate::TransformData;

    if (d_ptr->transformData->xOrigin == newOrigin.x()
        && d_ptr->transformData->yOrigin == newOrigin.y()) {
        return;
    }

    d_ptr->transformData->xOrigin = newOrigin.x();
    d_ptr->transformData->yOrigin = newOrigin.y();
    d_ptr->transformData->onlyTransform = false;
    d_ptr->dirtySceneTransform = 1;

    // Send post-notification.
    if (d_ptr->flags & ItemSendsGeometryChanges)
        itemChange(ItemTransformOriginPointHasChanged, QVariant::fromValue<QPointF>(newOrigin));
}